

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteDlidxAppend(Fts5Index *p,Fts5SegWriter *pWriter,i64 iRowid)

{
  u8 *puVar1;
  uint uVar2;
  Fts5Index *p_00;
  char *in_RDX;
  long in_RSI;
  long *in_RDI;
  i64 iPgno;
  i64 iFirst;
  Fts5DlidxWriter *pDlidx;
  i64 iVal;
  int bDone;
  int i;
  int in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc0;
  Fts5SegWriter *in_stack_ffffffffffffffc8;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  iVar4 = 0;
  while( true ) {
    uVar2 = in_stack_ffffffffffffffbc & 0xffffff;
    if (*(int *)((long)in_RDI + 0x3c) == 0) {
      uVar2 = CONCAT13(iVar3 == 0,(int3)in_stack_ffffffffffffffbc);
    }
    in_stack_ffffffffffffffbc = uVar2;
    if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') break;
    p_00 = (Fts5Index *)(*(long *)(in_RSI + 0x58) + (long)iVar4 * 0x20);
    if (*(int *)&p_00->pHash < *(int *)(*in_RDI + 0xc4)) {
      iVar3 = 1;
    }
    else {
      **(undefined1 **)&p_00->nWorkUnit = 1;
      fts5DataWrite((Fts5Index *)CONCAT44(iVar4,iVar3),-0x5555555555555556,(u8 *)p_00,
                    (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      fts5WriteDlidxGrow(p_00,in_stack_ffffffffffffffc8,
                         (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      p_00 = (Fts5Index *)(*(long *)(in_RSI + 0x58) + (long)iVar4 * 0x20);
      if ((*(int *)((long)in_RDI + 0x3c) == 0) && (p_00->nPendingRow == 0)) {
        in_stack_ffffffffffffffc8 = (Fts5SegWriter *)fts5DlidxExtractFirstRowid((Fts5Buffer *)p_00);
        p_00->nPendingData = *(int *)&p_00->pConfig;
        sqlite3Fts5BufferAppendVarint
                  (in_stack_ffffffffffffffc0,
                   (Fts5Buffer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   0x2794c0);
        sqlite3Fts5BufferAppendVarint
                  (in_stack_ffffffffffffffc0,
                   (Fts5Buffer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   0x2794e3);
        sqlite3Fts5BufferAppendVarint
                  (in_stack_ffffffffffffffc0,
                   (Fts5Buffer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   0x279503);
        *(undefined4 *)&p_00->field_0x24 = 1;
        p_00->iWriteRowid = (i64)in_stack_ffffffffffffffc8;
      }
      sqlite3Fts5BufferZero((Fts5Buffer *)&p_00->nWorkUnit);
      puVar1 = (u8 *)((long)&p_00->pConfig + 4);
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(int *)&p_00->pConfig = *(int *)&p_00->pConfig + 1;
    }
    if (*(int *)((long)&p_00->pConfig + 4) == 0) {
      if (iVar4 == 0) {
        in_stack_ffffffffffffffb8 = *(int *)(in_RSI + 8);
      }
      else {
        in_stack_ffffffffffffffb8 = *(int *)&p_00[-1].pDeleteFromIdx;
      }
      in_stack_ffffffffffffffc0 = (int *)(long)in_stack_ffffffffffffffb8;
      sqlite3Fts5BufferAppendVarint
                (in_stack_ffffffffffffffc0,
                 (Fts5Buffer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 0x2795bf);
      sqlite3Fts5BufferAppendVarint
                (in_stack_ffffffffffffffc0,
                 (Fts5Buffer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 0x2795db);
    }
    sqlite3Fts5BufferAppendVarint
              (in_stack_ffffffffffffffc0,
               (Fts5Buffer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0x279601)
    ;
    puVar1 = (u8 *)((long)&p_00->pConfig + 4);
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    p_00->zDataTbl = in_RDX;
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

static void fts5WriteDlidxAppend(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  i64 iRowid
){
  int i;
  int bDone = 0;

  for(i=0; p->rc==SQLITE_OK && bDone==0; i++){
    i64 iVal;
    Fts5DlidxWriter *pDlidx = &pWriter->aDlidx[i];

    if( pDlidx->buf.n>=p->pConfig->pgsz ){
      /* The current doclist-index page is full. Write it to disk and push
      ** a copy of iRowid (which will become the first rowid on the next
      ** doclist-index leaf page) up into the next level of the b-tree
      ** hierarchy. If the node being flushed is currently the root node,
      ** also push its first rowid upwards. */
      pDlidx->buf.p[0] = 0x01;    /* Not the root node */
      fts5DataWrite(p,
          FTS5_DLIDX_ROWID(pWriter->iSegid, i, pDlidx->pgno),
          pDlidx->buf.p, pDlidx->buf.n
      );
      fts5WriteDlidxGrow(p, pWriter, i+2);
      pDlidx = &pWriter->aDlidx[i];
      if( p->rc==SQLITE_OK && pDlidx[1].buf.n==0 ){
        i64 iFirst = fts5DlidxExtractFirstRowid(&pDlidx->buf);

        /* This was the root node. Push its first rowid up to the new root. */
        pDlidx[1].pgno = pDlidx->pgno;
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, 0);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, pDlidx->pgno);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, iFirst);
        pDlidx[1].bPrevValid = 1;
        pDlidx[1].iPrev = iFirst;
      }

      sqlite3Fts5BufferZero(&pDlidx->buf);
      pDlidx->bPrevValid = 0;
      pDlidx->pgno++;
    }else{
      bDone = 1;
    }

    if( pDlidx->bPrevValid ){
      iVal = (u64)iRowid - (u64)pDlidx->iPrev;
    }else{
      i64 iPgno = (i==0 ? pWriter->writer.pgno : pDlidx[-1].pgno);
      assert( pDlidx->buf.n==0 );
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, !bDone);
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iPgno);
      iVal = iRowid;
    }

    sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iVal);
    pDlidx->bPrevValid = 1;
    pDlidx->iPrev = iRowid;
  }
}